

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

char * spvc_compiler_get_cleansed_entry_point_name
                 (spvc_compiler compiler,char *name,SpvExecutionModel model)

{
  pointer this;
  string *psVar1;
  char *pcVar2;
  exception *e;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string cleansed_name;
  SpvExecutionModel model_local;
  char *name_local;
  spvc_compiler compiler_local;
  
  cleansed_name.field_2._12_4_ = model;
  this = std::unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
         operator->(&compiler->compiler);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,name,&local_69);
  psVar1 = spirv_cross::Compiler::get_cleansed_entry_point_name
                     (this,&local_68,cleansed_name.field_2._12_4_);
  std::__cxx11::string::string((string *)local_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  pcVar2 = spvc_context_s::allocate_name(compiler->context,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return pcVar2;
}

Assistant:

const char *spvc_compiler_get_cleansed_entry_point_name(spvc_compiler compiler, const char *name,
                                                        SpvExecutionModel model)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto cleansed_name =
		    compiler->compiler->get_cleansed_entry_point_name(name, static_cast<spv::ExecutionModel>(model));
		return compiler->context->allocate_name(cleansed_name);
	}